

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O0

void __thiscall EventMultiplexer::prepareNextState(EventMultiplexer *this)

{
  uint uVar1;
  size_type sVar2;
  reference ppSVar3;
  uint local_1c;
  uint local_18;
  uint i_1;
  uint amount;
  uint i;
  EventMultiplexer *this_local;
  
  if (((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
       stochNextStateIsPrepared & 1U) == 0) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochCurrentValue;
    (this->super_StochasticEventGenerator).eventNextValue = false;
    if ((this->multiMode & 1U) == 0) {
      local_18 = 0;
      for (local_1c = 0;
          sVar2 = std::
                  vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::
                  size(&this->multiSources), local_1c < sVar2; local_1c = local_1c + 1) {
        ppSVar3 = std::
                  vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::
                  operator[](&this->multiSources,(ulong)local_1c);
        if (*ppSVar3 != (value_type)0x0) {
          ppSVar3 = std::
                    vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                    ::operator[](&this->multiSources,(ulong)local_1c);
          uVar1 = (*((*ppSVar3)->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                    _vptr_Parametric[0xf])();
          if ((uVar1 & 1) != 0) {
            local_18 = local_18 + 1;
          }
        }
      }
      sVar2 = std::vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::
              size(&this->multiSources);
      if (local_18 == sVar2) {
        (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        stochNextValue =
             (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess
             .stochNextValue + 1.0;
        (this->super_StochasticEventGenerator).eventNextValue = true;
      }
    }
    else {
      for (i_1 = 0; sVar2 = std::
                            vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                            ::size(&this->multiSources), i_1 < sVar2; i_1 = i_1 + 1) {
        ppSVar3 = std::
                  vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::
                  operator[](&this->multiSources,(ulong)i_1);
        if (*ppSVar3 != (value_type)0x0) {
          ppSVar3 = std::
                    vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                    ::operator[](&this->multiSources,(ulong)i_1);
          uVar1 = (*((*ppSVar3)->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                    _vptr_Parametric[0xf])();
          if ((uVar1 & 1) != 0) {
            (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
            stochNextValue =
                 (this->super_StochasticEventGenerator).super_StochasticVariable.
                 super_StochasticProcess.stochNextValue + 1.0;
            (this->super_StochasticEventGenerator).eventNextValue = true;
          }
        }
      }
    }
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void EventMultiplexer::prepareNextState()
{
    if (!stochNextStateIsPrepared) {
        stochNextValue = stochCurrentValue;
        eventNextValue = false;
        if (multiMode) {
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent()) {
                    stochNextValue += 1.0;
                    eventNextValue = true;
                }
            }
        } else {
            uint amount = 0;
            for (uint i=0; i<multiSources.size(); i++) {
                if (multiSources[i] && multiSources[i]->hasEvent())
                    ++amount;
            }
            if (amount == multiSources.size()) {
                stochNextValue += 1.0;
                eventNextValue = true;
            }
        }
        stochNextStateIsPrepared = true;
    }
}